

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O1

void Acb_NtkCollectNewTfi1_rec(Acb_Ntk_t *p,int iObj,Vec_Int_t *vTfiNew)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  if ((-1 < iObj) && (iObj < (p->vObjTrav).nSize)) {
    piVar3 = (p->vObjTrav).pArray;
    iVar1 = piVar3[(uint)iObj];
    iVar2 = p->nObjTravs;
    if ((iVar1 != iVar2 + -1) || (piVar3[(uint)iObj] = iVar2, iVar1 == iVar2)) {
      return;
    }
    if (iObj == 0) {
      __assert_fail("i>0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                    ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
    }
    if (iObj < (p->vObjFans).nSize) {
      iVar1 = (p->vObjFans).pArray[(uint)iObj];
      lVar6 = (long)iVar1;
      if ((-1 < lVar6) && (iVar1 < (p->vFanSto).nSize)) {
        piVar3 = (p->vFanSto).pArray;
        if (0 < piVar3[lVar6]) {
          lVar5 = 0;
          do {
            lVar4 = lVar5 + 1;
            lVar5 = lVar5 + 1;
            Acb_NtkCollectNewTfi1_rec(p,piVar3[lVar6 + lVar4],vTfiNew);
          } while (lVar5 < piVar3[lVar6]);
        }
        Vec_IntPush(vTfiNew,iObj);
        return;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Acb_NtkCollectNewTfi1_rec( Acb_Ntk_t * p, int iObj, Vec_Int_t * vTfiNew )
{
    int i, iFanin, * pFanins;
    if ( !Acb_ObjIsTravIdPrev(p, iObj) )
        return;
    if ( Acb_ObjSetTravIdCur(p, iObj) )
        return;
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, i )
        Acb_NtkCollectNewTfi1_rec( p, iFanin, vTfiNew );
    Vec_IntPush( vTfiNew, iObj );
}